

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadInsertElimPass::EliminateDeadInsertsOnePass
          (DeadInsertElimPass *this,Function *func)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  int32_t iVar4;
  Op OVar5;
  DefUseManager *pDVar6;
  Instruction *pIVar7;
  IRContext *this_00;
  reference ppIVar8;
  value_type *__x;
  anon_class_8_1_fd9fcb40 local_150;
  function<void_(spvtools::opt::Instruction_*)> local_148;
  Instruction *local_128;
  Instruction *inst;
  uint32_t local_114;
  _Node_iterator_base<unsigned_int,_false> _Stack_110;
  uint32_t replId;
  _Node_iterator_base<unsigned_int,_false> local_108;
  uint32_t local_fc;
  undefined1 local_f8 [4];
  uint32_t id_1;
  undefined1 local_f0 [8];
  iterator ii_1;
  undefined1 local_d8 [8];
  iterator bi_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  dead_instructions;
  function<void_(spvtools::opt::Instruction_*)> local_a0;
  uint32_t local_7c;
  DebugScope DStack_78;
  uint32_t id;
  undefined1 local_64 [12];
  Instruction *typeInst;
  Op op;
  undefined1 local_48 [8];
  iterator ii;
  undefined1 local_30 [8];
  iterator bi;
  bool modified;
  Function *func_local;
  DeadInsertElimPass *this_local;
  
  bi.iterator_._M_current._7_1_ = 0;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->liveInserts_);
  std::
  unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::clear(&this->visitedPhis_);
  _local_30 = opt::Function::begin(func);
  do {
    _ii = opt::Function::end(func);
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&ii);
    if (!bVar2) {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &bi_1.iterator_);
      _local_d8 = opt::Function::begin(func);
      while( true ) {
        _ii_1 = opt::Function::end(func);
        bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_d8,
                           (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&ii_1);
        if (!bVar2) break;
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_d8);
        BasicBlock::begin((BasicBlock *)local_f0);
        while( true ) {
          UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_d8);
          BasicBlock::end((BasicBlock *)local_f8);
          bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_f0,
                                    (iterator_template<spvtools::opt::Instruction> *)local_f8);
          if (!bVar2) break;
          pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)local_f0);
          OVar5 = opt::Instruction::opcode(pIVar7);
          if (OVar5 == OpCompositeInsert) {
            pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator->
                               ((iterator_template<spvtools::opt::Instruction> *)local_f0);
            local_fc = opt::Instruction::result_id(pIVar7);
            local_108._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(&this->liveInserts_,&local_fc);
            _Stack_110._M_cur =
                 (__node_type *)
                 std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::end(&this->liveInserts_);
            bVar2 = std::__detail::operator!=(&local_108,&stack0xfffffffffffffef0);
            if (!bVar2) {
              pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                       iterator_template<spvtools::opt::Instruction>::operator->
                                 ((iterator_template<spvtools::opt::Instruction> *)local_f0);
              local_114 = opt::Instruction::GetSingleWordInOperand(pIVar7,1);
              this_00 = Pass::context((Pass *)this);
              IRContext::ReplaceAllUsesWith(this_00,local_fc,local_114);
              inst = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               ((iterator_template<spvtools::opt::Instruction> *)local_f0);
              std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         *)&bi_1.iterator_,&inst);
              bi.iterator_._M_current._7_1_ = 1;
            }
          }
          InstructionList::iterator::operator++((iterator *)local_f0);
        }
        UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_d8);
      }
      while (bVar2 = std::
                     vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ::empty((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              *)&bi_1.iterator_), bVar1 = bi.iterator_._M_current._7_1_,
            ((bVar2 ^ 0xffU) & 1) != 0) {
        ppIVar8 = std::
                  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          *)&bi_1.iterator_);
        local_128 = *ppIVar8;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        pop_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&bi_1.iterator_);
        pIVar7 = local_128;
        local_150.dead_instructions =
             (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &bi_1.iterator_;
        std::function<void(spvtools::opt::Instruction*)>::
        function<spvtools::opt::DeadInsertElimPass::EliminateDeadInsertsOnePass(spvtools::opt::Function*)::__1,void>
                  ((function<void(spvtools::opt::Instruction*)> *)&local_148,&local_150);
        MemPass::DCEInst(&this->super_MemPass,pIVar7,&local_148);
        std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_148);
      }
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&bi_1.iterator_);
      return (bool)(bVar1 & 1);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30);
    BasicBlock::begin((BasicBlock *)local_48);
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30);
      BasicBlock::end((BasicBlock *)&stack0xffffffffffffffb0);
      bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_48,
                                (iterator_template<spvtools::opt::Instruction> *)
                                &stack0xffffffffffffffb0);
      if (!bVar2) break;
      pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_48);
      typeInst._4_4_ = opt::Instruction::opcode(pIVar7);
      pDVar6 = Pass::get_def_use_mgr((Pass *)this);
      pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_48);
      uVar3 = opt::Instruction::type_id(pIVar7);
      local_64._4_8_ = analysis::DefUseManager::GetDef(pDVar6,uVar3);
      if (typeInst._4_4_ == OpCompositeInsert) {
LAB_0091c84c:
        if ((typeInst._4_4_ == OpCompositeInsert) &&
           (OVar5 = opt::Instruction::opcode((Instruction *)local_64._4_8_), OVar5 == OpTypeArray))
        {
          pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)local_48);
          local_64._0_4_ = opt::Instruction::result_id(pIVar7);
          DStack_78 = (DebugScope)
                      std::
                      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool>
                                *)&this->liveInserts_,
                               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)local_64,__x);
        }
        else {
          pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)local_48);
          local_7c = opt::Instruction::result_id(pIVar7);
          pDVar6 = Pass::get_def_use_mgr((Pass *)this);
          uVar3 = local_7c;
          dead_instructions.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
          std::function<void(spvtools::opt::Instruction*)>::
          function<spvtools::opt::DeadInsertElimPass::EliminateDeadInsertsOnePass(spvtools::opt::Function*)::__0,void>
                    ((function<void(spvtools::opt::Instruction*)> *)&local_a0,
                     (anon_class_16_2_51561657 *)
                     &dead_instructions.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          analysis::DefUseManager::ForEachUser(pDVar6,uVar3,&local_a0);
          std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_a0);
        }
      }
      else if (typeInst._4_4_ == OpPhi) {
        OVar5 = opt::Instruction::opcode((Instruction *)local_64._4_8_);
        iVar4 = spvOpcodeIsComposite(OVar5);
        if (iVar4 != 0) goto LAB_0091c84c;
      }
      InstructionList::iterator::operator++((iterator *)local_48);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_30);
  } while( true );
}

Assistant:

bool DeadInsertElimPass::EliminateDeadInsertsOnePass(Function* func) {
  bool modified = false;
  liveInserts_.clear();
  visitedPhis_.clear();
  // Mark all live inserts
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      // Only process Inserts and composite Phis
      spv::Op op = ii->opcode();
      Instruction* typeInst = get_def_use_mgr()->GetDef(ii->type_id());
      if (op != spv::Op::OpCompositeInsert &&
          (op != spv::Op::OpPhi || !spvOpcodeIsComposite(typeInst->opcode())))
        continue;
      // The marking algorithm can be expensive for large arrays and the
      // efficacy of eliminating dead inserts into arrays is questionable.
      // Skip optimizing array inserts for now. Just mark them live.
      // TODO(greg-lunarg): Eliminate dead array inserts
      if (op == spv::Op::OpCompositeInsert) {
        if (typeInst->opcode() == spv::Op::OpTypeArray) {
          liveInserts_.insert(ii->result_id());
          continue;
        }
      }
      const uint32_t id = ii->result_id();
      get_def_use_mgr()->ForEachUser(id, [&ii, this](Instruction* user) {
        if (user->IsCommonDebugInstr()) return;
        switch (user->opcode()) {
          case spv::Op::OpCompositeInsert:
          case spv::Op::OpPhi:
            // Use by insert or phi does not initiate marking
            break;
          case spv::Op::OpCompositeExtract: {
            // Capture extract indices
            std::vector<uint32_t> extIndices;
            uint32_t icnt = 0;
            user->ForEachInOperand([&icnt, &extIndices](const uint32_t* idp) {
              if (icnt > 0) extIndices.push_back(*idp);
              ++icnt;
            });
            // Mark all inserts in chain that intersect with extract
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, &extIndices, 0, &visited_phis);
          } break;
          default: {
            // Mark inserts in chain for all components
            std::unordered_set<uint32_t> visited_phis;
            MarkInsertChain(&*ii, nullptr, 0, &visited_phis);
          } break;
        }
      });
    }
  }
  // Find and disconnect dead inserts
  std::vector<Instruction*> dead_instructions;
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      if (ii->opcode() != spv::Op::OpCompositeInsert) continue;
      const uint32_t id = ii->result_id();
      if (liveInserts_.find(id) != liveInserts_.end()) continue;
      const uint32_t replId =
          ii->GetSingleWordInOperand(kInsertCompositeIdInIdx);
      (void)context()->ReplaceAllUsesWith(id, replId);
      dead_instructions.push_back(&*ii);
      modified = true;
    }
  }
  // DCE dead inserts
  while (!dead_instructions.empty()) {
    Instruction* inst = dead_instructions.back();
    dead_instructions.pop_back();
    DCEInst(inst, [&dead_instructions](Instruction* other_inst) {
      auto i = std::find(dead_instructions.begin(), dead_instructions.end(),
                         other_inst);
      if (i != dead_instructions.end()) {
        dead_instructions.erase(i);
      }
    });
  }
  return modified;
}